

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expand.c
# Opt level: O1

unsigned_long bit_offset(dmr_C *C,expression *expr)

{
  unsigned_long uVar1;
  
  if (*(char *)expr == '\x1b') {
    uVar1 = 0;
    do {
      uVar1 = uVar1 + (long)(expr->field_5).field_2.wide * (long)C->target->bits_in_char;
      expr = (expr->field_5).field_6.right;
    } while (*(char *)expr == '\x1b');
  }
  else {
    uVar1 = 0;
  }
  if (expr->ctype != (symbol *)0x0) {
    uVar1 = uVar1 + *(byte *)((long)&expr->ctype->field_14 + 0xc);
  }
  return uVar1;
}

Assistant:

static unsigned long bit_offset(struct dmr_C *C, const struct expression *expr)
{
	unsigned long offset = 0;
	while (expr->type == EXPR_POS) {
		offset += dmrC_bytes_to_bits(C->target, expr->init_offset);
		expr = expr->init_expr;
	}
	if (expr && expr->ctype)
		offset += expr->ctype->bit_offset;
	return offset;
}